

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

void TTA::MemUpdateTable(uint u,uint v)

{
  int *piVar1;
  pointer puVar2;
  pointer piVar3;
  pointer puVar4;
  pointer piVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  piVar5 = mem_next_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = mem_next_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = v;
  if (u < v) {
    for (; uVar6 = u, uVar7 = v, uVar8 != 0xffffffff; uVar8 = puVar4[(int)uVar8]) {
      piVar1 = piVar3 + (int)uVar8;
      *piVar1 = *piVar1 + 1;
      puVar2[(int)uVar8] = u;
      piVar1 = piVar5 + (int)uVar8;
      *piVar1 = *piVar1 + 1;
    }
  }
  else {
    uVar8 = u;
    if (u <= v) {
      return;
    }
    for (; uVar6 = v, uVar7 = u, uVar8 != 0xffffffff; uVar8 = puVar4[(int)uVar8]) {
      piVar1 = piVar3 + (int)uVar8;
      *piVar1 = *piVar1 + 1;
      puVar2[(int)uVar8] = v;
      piVar1 = piVar5 + (int)uVar8;
      *piVar1 = *piVar1 + 1;
    }
  }
  piVar3 = mem_tail_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  mem_tail_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar6] =
       mem_tail_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[(int)uVar6] + 1;
  puVar2 = mem_tail_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = mem_tail_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar6];
  mem_next_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar8] =
       mem_next_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[(int)uVar8] + 1;
  mem_next_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[(int)uVar8] = uVar7;
  piVar1 = piVar3 + (int)uVar7;
  *piVar1 = *piVar1 + 1;
  uVar8 = puVar2[(int)uVar7];
  piVar1 = piVar3 + (int)uVar6;
  *piVar1 = *piVar1 + 1;
  puVar2[(int)uVar6] = uVar8;
  return;
}

Assistant:

static void MemUpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                mem_rtable_[i] = u;
                i = mem_next_[i];
            }
            mem_next_[mem_tail_[u]] = v;
            mem_tail_[u] = mem_tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                mem_rtable_[i] = v;
                i = mem_next_[i];
            }
            mem_next_[mem_tail_[v]] = u;
            mem_tail_[v] = mem_tail_[u];
        }
    }